

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
::operator()(arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
             *this,longdouble value)

{
  ostream_type *poVar1;
  char *pcVar2;
  char *extraout_RDX;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RSI;
  type tVar3;
  format_specs local_28;
  
  poVar1 = in_RSI[1].out_._M_stream;
  if (poVar1 == (ostream_type *)0x0) {
    local_28.super_align_spec.width_ = 0;
    local_28.super_align_spec.fill_ = L' ';
    local_28.super_align_spec.align_ = ALIGN_DEFAULT;
    local_28.super_core_format_specs.precision = -1;
    local_28.super_core_format_specs.flags = '\0';
    local_28.super_core_format_specs.type = '\0';
  }
  else {
    local_28.super_core_format_specs._4_2_ = *(undefined2 *)(poVar1 + 0x10);
    local_28.super_align_spec._0_8_ = *(undefined8 *)poVar1;
    local_28._8_8_ = *(undefined8 *)(poVar1 + 8);
  }
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  ::write_double<long_double>(in_RSI,value,&local_28);
  pcVar2 = (in_RSI->out_)._M_string;
  *(ostream_type **)this = (in_RSI->out_)._M_stream;
  *(char **)(this + 8) = pcVar2;
  tVar3._M_string = extraout_RDX;
  tVar3._M_stream = (ostream_type *)this;
  return tVar3;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }